

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLEventsSource.cpp
# Opt level: O2

Event * __thiscall
solitaire::events::SDLEventsSource::getEvent(Event *__return_storage_ptr__,SDLEventsSource *this)

{
  long *plVar1;
  Event *pEVar2;
  SDL_Event event;
  uint local_48 [4];
  char local_38;
  Event *local_34;
  
  do {
    while( true ) {
      while( true ) {
        plVar1 = *(long **)&(__return_storage_ptr__->
                            super__Variant_base<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
                            ).
                            super__Move_assign_alias<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
                            .
                            super__Copy_assign_alias<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
                            .
                            super__Move_ctor_alias<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
                            .
                            super__Copy_ctor_alias<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
                            .
                            super__Variant_storage_alias<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
                            ._M_index;
        pEVar2 = (Event *)(**(code **)(*plVar1 + 0x20))(plVar1,local_48);
        if ((int)pEVar2 == 0) {
          return pEVar2;
        }
        if (local_48[0] != 0x401) break;
        if (local_38 == '\x01') {
          return local_34;
        }
      }
      if (local_48[0] != 0x402) break;
      if (local_38 == '\x01') {
        return (Event *)(ulong)local_48[0];
      }
    }
    if (local_48[0] == 0x100) {
      return (Event *)(ulong)local_48[0];
    }
  } while (local_48[0] != 0x400);
  return local_34;
}

Assistant:

Event SDLEventsSource::getEvent() const {
    SDL_Event event;

    while (sdl->pollEvent(event)) {
        switch (event.type) {
        case SDL_MOUSEBUTTONDOWN:
            if (event.button.button == SDL_BUTTON_LEFT)
                return MouseLeftButtonDown {Position {event.button.x, event.button.y}};
            break;

        case SDL_MOUSEBUTTONUP:
            if (event.button.button == SDL_BUTTON_LEFT)
                return MouseLeftButtonUp {};
            break;

        case SDL_MOUSEMOTION:
            return MouseMove {event.motion.x, event.motion.y};

        case SDL_QUIT:
            return Quit {};
        }
    }

    return NoEvents {};
}